

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PPointer::WriteValue(PPointer *this,FSerializer *ar,char *key,void *addr)

{
  PType *pPVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  bool bVar5;
  
  pPVar2 = PClass::RegistrationInfo.MyClass;
  pPVar1 = this->PointedType;
  if ((pPVar1->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
    iVar3 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
    (pPVar1->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
  }
  pPVar4 = (pPVar1->super_PTypeBase).super_DObject.Class;
  bVar5 = pPVar4 != (PClass *)0x0;
  if (pPVar4 != pPVar2 && bVar5) {
    do {
      pPVar4 = pPVar4->ParentClass;
      bVar5 = pPVar4 != (PClass *)0x0;
      if (pPVar4 == pPVar2) break;
    } while (pPVar4 != (PClass *)0x0);
  }
  if (bVar5) {
    ::Serialize(ar,key,(DObject **)addr,(DObject **)0x0,(bool *)0x0);
    return;
  }
  __assert_fail("0 && \"Pointer points to a type we don\'t handle\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                ,0x67d,
                "virtual void PPointer::WriteValue(FSerializer &, const char *, const void *) const"
               );
}

Assistant:

void PPointer::WriteValue(FSerializer &ar, const char *key,const void *addr) const
{
	if (PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
	{
		ar(key, *(DObject **)addr);
	}
	else
	{
		assert(0 && "Pointer points to a type we don't handle");
		I_Error("Attempt to save pointer to unhandled type");
	}
}